

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynFor * ParseFor(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynVariableDefinitions *initializer;
  SynBase *condition;
  undefined4 extraout_var;
  SynBlock *increment;
  SynBase *body;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Lexeme *pLVar2;
  
  begin = ctx->currentLexeme;
  if (begin->type != lex_for) {
    return (SynFor *)0x0;
  }
  ctx->currentLexeme = begin + 1;
  anon_unknown.dwarf_1519a::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'for\'");
  if (ctx->currentLexeme->type == lex_ofigure) {
    initializer = (SynVariableDefinitions *)ParseBlock(ctx);
  }
  else {
    initializer = ParseVariableDefinitions(ctx,false);
    if (initializer != (SynVariableDefinitions *)0x0) goto LAB_00115813;
    initializer = (SynVariableDefinitions *)ParseAssignment(ctx);
    if (initializer == (SynVariableDefinitions *)0x0) {
      pLVar2 = ctx->currentLexeme;
      if (pLVar2->type == lex_semicolon) {
        ctx->currentLexeme = pLVar2 + 1;
        initializer = (SynVariableDefinitions *)0x0;
      }
      else {
        initializer = (SynVariableDefinitions *)0x0;
        anon_unknown.dwarf_1519a::Report
                  (ctx,pLVar2,"ERROR: \';\' not found after initializer in \'for\'");
      }
      goto LAB_00115813;
    }
  }
  anon_unknown.dwarf_1519a::CheckConsume
            (ctx,lex_semicolon,"ERROR: \';\' not found after initializer in \'for\'");
LAB_00115813:
  condition = ParseAssignment(ctx);
  if (condition == (SynBase *)0x0) {
    anon_unknown.dwarf_1519a::Report
              (ctx,ctx->currentLexeme,"ERROR: condition not found in \'for\' statement");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    condition = (SynBase *)CONCAT44(extraout_var,iVar1);
    SynError::SynError((SynError *)condition,ctx->currentLexeme,ctx->currentLexeme);
  }
  anon_unknown.dwarf_1519a::CheckConsume
            (ctx,lex_semicolon,"ERROR: \';\' not found after condition in \'for\'");
  if (ctx->currentLexeme->type == lex_ofigure) {
    increment = ParseBlock(ctx);
  }
  else {
    increment = (SynBlock *)ParseAssignment(ctx);
  }
  anon_unknown.dwarf_1519a::CheckConsume
            (ctx,lex_cparen,"ERROR: \')\' not found after \'for\' statement");
  body = ParseExpression(ctx);
  if (body == (SynBase *)0x0) {
    anon_unknown.dwarf_1519a::Report
              (ctx,ctx->currentLexeme,"ERROR: body not found after \'for\' header");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    body = (SynBase *)CONCAT44(extraout_var_00,iVar1);
    SynError::SynError((SynError *)body,ctx->currentLexeme,ctx->currentLexeme);
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  pLVar2 = ParseContext::Previous(ctx);
  SynFor::SynFor((SynFor *)CONCAT44(extraout_var_01,iVar1),begin,pLVar2,&initializer->super_SynBase,
                 condition,&increment->super_SynBase,body);
  return (SynFor *)CONCAT44(extraout_var_01,iVar1);
}

Assistant:

SynFor* ParseFor(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_for))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'for'");

		SynBase *initializer = NULL;

		if(ctx.At(lex_ofigure))
		{
			initializer = ParseBlock(ctx);

			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after initializer in 'for'");
		}
		else if(SynBase *node = ParseVariableDefinitions(ctx, false))
		{
			initializer = node;
		}
		else if(SynBase *node = ParseAssignment(ctx))
		{
			initializer = node;

			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after initializer in 'for'");
		}
		else if(!ctx.Consume(lex_semicolon))
		{
			Report(ctx, ctx.Current(), "ERROR: ';' not found after initializer in 'for'");
		}

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'for' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after condition in 'for'");

		SynBase *increment = NULL;

		if(ctx.At(lex_ofigure))
			increment = ParseBlock(ctx);
		else if(SynBase *node = ParseAssignment(ctx))
			increment = node;

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after 'for' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body)
		{
			Report(ctx, ctx.Current(), "ERROR: body not found after 'for' header");

			body = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynFor>()) SynFor(start, ctx.Previous(), initializer, condition, increment, body);
	}

	return NULL;
}